

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t unpack_16bit_4chan_interleave_rev(exr_decode_pipeline_t *decode)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  exr_coding_channel_info_t *peVar4;
  long lVar5;
  uint64_t *outall;
  uint8_t *puVar6;
  void *pvVar7;
  void *pvVar8;
  long lVar9;
  void *pvVar10;
  void *pvVar11;
  int iVar12;
  
  iVar1 = (decode->chunk).height;
  if (0 < iVar1) {
    peVar4 = decode->channels;
    uVar2 = peVar4->width;
    lVar5 = (long)(int)uVar2;
    puVar6 = peVar4[3].field_12.decode_to_ptr;
    iVar3 = peVar4->user_line_stride;
    pvVar8 = decode->unpacked_buffer;
    lVar9 = (long)(int)(uVar2 * 8);
    pvVar10 = (void *)((long)pvVar8 + lVar5 * 6);
    pvVar11 = (void *)((long)pvVar8 + lVar5 * 4);
    pvVar7 = (void *)((long)pvVar8 + lVar5 * 2);
    iVar12 = 0;
    do {
      if (0 < (int)uVar2) {
        lVar5 = 0;
        do {
          *(ulong *)(puVar6 + lVar5 * 4) =
               (ulong)*(ushort *)((long)pvVar11 + lVar5) << 0x10 |
               (ulong)*(ushort *)((long)pvVar7 + lVar5) << 0x20 |
               (ulong)*(ushort *)((long)pvVar8 + lVar5) << 0x30 |
               (ulong)*(ushort *)((long)pvVar10 + lVar5);
          lVar5 = lVar5 + 2;
        } while ((ulong)uVar2 * 2 != lVar5);
      }
      pvVar8 = (void *)((long)pvVar8 + lVar9);
      puVar6 = puVar6 + iVar3;
      iVar12 = iVar12 + 1;
      pvVar10 = (void *)((long)pvVar10 + lVar9);
      pvVar11 = (void *)((long)pvVar11 + lVar9);
      pvVar7 = (void *)((long)pvVar7 + lVar9);
    } while (iVar12 != iVar1);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_4chan_interleave_rev (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2, *in3;
    uint8_t*        out0;
    int             w, h;
    int             linc0;
    /* TODO: can do this with sse and do 2 outpixels at once */
    union
    {
        struct
        {
            uint16_t r;
            uint16_t g;
            uint16_t b;
            uint16_t a;
        };
        uint64_t allc;
    } combined;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[3].decode_to_ptr;

    /* interleaving case, we can do this! */
    for (int y = 0; y < h; ++y)
    {
        uint64_t* outall = (uint64_t*) out0;
        in0              = (const uint16_t*) srcbuffer;
        in1              = in0 + w;
        in2              = in1 + w;
        in3              = in2 + w;

        srcbuffer += w * 8; // 4 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            combined.a = one_to_native16 (in0[x]);
            combined.b = one_to_native16 (in1[x]);
            combined.g = one_to_native16 (in2[x]);
            combined.r = one_to_native16 (in3[x]);
            outall[x]  = combined.allc;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}